

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O2

void __thiscall CCDPP_MPI::train(CCDPP_MPI *this)

{
  unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
  *this_00;
  value_type_conflict1 *pvVar1;
  double *pdVar2;
  value_type_conflict1 *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  value_type_conflict1 *global_the_other;
  value_type_conflict1 *pvVar11;
  mapped_type *pmVar12;
  pointer pRVar13;
  ostream *poVar14;
  Parameter *pPVar15;
  int item_index;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  int d;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  value_type_conflict1 vVar22;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar23;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  value_type_conflict1 global_reg;
  ulong local_108;
  uint local_fc;
  value_type_conflict1 global_reg_1;
  value_type_conflict1 global_loss;
  value_type_conflict1 *local_e8;
  value_type_conflict1 *local_e0;
  int local_d4;
  value_type_conflict1 *local_d0;
  _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_c8;
  value_type_conflict1 *local_c0;
  double local_b8;
  double local_b0;
  value_type_conflict1 *local_a8;
  value_type_conflict1 global_loss_1;
  uint local_94;
  double local_90;
  ulong local_88;
  value_type_conflict1 loss;
  double local_78;
  undefined8 uStack_70;
  Monitor timer;
  
  uVar21 = 0xffffffffffffffff;
  uVar18 = (long)this->Q_workload * 8;
  if ((long)this->Q_workload < 0) {
    uVar18 = uVar21;
  }
  pvVar11 = (value_type_conflict1 *)operator_new__(uVar18);
  uVar18 = (long)this->P_workload * 8;
  if ((long)this->P_workload < 0) {
    uVar18 = uVar21;
  }
  local_a8 = (value_type_conflict1 *)operator_new__(uVar18);
  uVar18 = (long)this->user_num * 8;
  if ((long)this->user_num < 0) {
    uVar18 = uVar21;
  }
  local_e0 = (value_type_conflict1 *)operator_new__(uVar18);
  uVar18 = (long)this->item_num * 8;
  if ((long)this->item_num < 0) {
    uVar18 = uVar21;
  }
  local_e8 = (value_type_conflict1 *)operator_new__(uVar18);
  local_108 = 0;
  pPVar15 = this->parameter;
  local_d0 = pvVar11;
  if (pPVar15->verbose == true) {
    for (iVar19 = 0; iVar19 < pPVar15->k; iVar19 = iVar19 + 1) {
      lVar17 = 0;
      while( true ) {
        if (this->end_user_id - this->start_user_id <= (int)lVar17) break;
        dVar23 = this->Q[(long)this->Q_workload * (long)iVar19 + lVar17];
        timer.startTimeInMicroSec =
             (double)CONCAT44(timer.startTimeInMicroSec._4_4_,this->start_user_id + (int)lVar17);
        pmVar12 = std::__detail::
                  _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->user_item_R,(key_type *)&timer);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = dVar23 * dVar23;
        lVar17 = lVar17 + 1;
        auVar24 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                     (long)(pmVar12->
                                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pmVar12->
                                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start >> 4);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_108;
        auVar24 = vfmadd213sd_fma(auVar24,auVar33,auVar4);
        local_108 = auVar24._0_8_;
      }
      pPVar15 = this->parameter;
    }
    auVar24 = ZEXT816(0) << 0x40;
    pRVar13 = (this->train_ratings).super__Vector_base<Rating,_std::allocator<Rating>_>._M_impl.
              super__Vector_impl_data._M_start;
    while (pRVar13 !=
           (this->train_ratings).super__Vector_base<Rating,_std::allocator<Rating>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      auVar34._8_8_ = 0;
      auVar34._0_8_ = pRVar13->score;
      pRVar13 = pRVar13 + 1;
      auVar24 = vfmadd231sd_fma(auVar24,auVar34,auVar34);
    }
    timer.startTimeInMicroSec = auVar24._0_8_;
    MPI_Allreduce(&local_108,&global_reg,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
    pvVar11 = local_d0;
    MPI_Allreduce(&timer,&global_loss,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
    if (this->machine_id == 0) {
      auVar25._8_8_ = 0;
      auVar25._0_8_ = global_reg;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = this->parameter->lambda;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = global_loss;
      auVar24 = vfmadd213sd_fma(auVar35,auVar25,auVar24);
      poVar14 = std::operator<<((ostream *)&std::cout,"machine id ");
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->machine_id);
      poVar14 = std::operator<<(poVar14,", iter ");
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,0);
      poVar14 = std::operator<<(poVar14,", rank ");
      poVar14 = std::operator<<(poVar14,"None");
      poVar14 = std::operator<<(poVar14,", time ");
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,0);
      std::operator<<(poVar14," sec, loss ");
      poVar14 = std::ostream::_M_insert<double>(global_loss);
      std::operator<<(poVar14,", obj ");
      poVar14 = std::ostream::_M_insert<double>(auVar24._0_8_);
      poVar14 = std::operator<<(poVar14,", diff ");
      poVar14 = std::operator<<(poVar14,"None");
      std::operator<<(poVar14,", reg ");
      poVar14 = std::ostream::_M_insert<double>(global_reg);
      std::endl<char,std::char_traits<char>>(poVar14);
      if (this->machine_id == 0) {
        std::operator<<((ostream *)&std::cout,"RMSE of training data: ");
        auVar26._0_8_ = global_loss / (double)this->train_rating_num;
        auVar26._8_8_ = 0;
        if (auVar26._0_8_ < 0.0) {
          dVar23 = sqrt(auVar26._0_8_);
        }
        else {
          auVar24 = vsqrtsd_avx(auVar26,auVar26);
          dVar23 = auVar24._0_8_;
        }
        poVar14 = std::ostream::_M_insert<double>(dVar23);
        std::endl<char,std::char_traits<char>>(poVar14);
      }
    }
  }
  local_c8 = (_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->user_item_R;
  this_00 = &this->item_user_R;
  uVar16 = 1;
  local_b8 = 0.0;
  local_90 = 0.0;
  do {
    pPVar15 = this->parameter;
    if (pPVar15->max_iter < (int)uVar16) {
      std::operator<<((ostream *)&std::cout,"training time: ");
      poVar14 = std::ostream::_M_insert<double>(local_b8);
      poVar14 = std::operator<<(poVar14," secs");
      std::endl<char,std::char_traits<char>>(poVar14);
      operator_delete__(local_e0);
      operator_delete__(local_e8);
      operator_delete__(local_a8);
      operator_delete__(pvVar11);
      return;
    }
    local_94 = uVar16 ^ 1;
    uVar21 = 0;
    local_d4 = 0;
    local_78 = 0.0;
    uStack_70 = 0;
    local_fc = uVar16;
    while( true ) {
      uVar20 = (uint)uVar21;
      if (pPVar15->k <= (int)uVar20) break;
      Monitor::start(&timer);
      pvVar11 = this->Q + (int)(this->Q_workload * uVar20);
      pvVar1 = this->P + (int)(this->P_workload * uVar20);
      init_factor(this,pvVar11,pvVar1,local_d0,local_a8);
      MPI_Allgather(pvVar11,this->Q_workload,&ompi_mpi_double,local_e0,this->Q_workload,
                    &ompi_mpi_double,&ompi_mpi_comm_world);
      uVar16 = local_fc;
      local_c0 = pvVar1;
      MPI_Allgather(pvVar1,this->P_workload,&ompi_mpi_double,local_e8,this->P_workload,
                    &ompi_mpi_double,&ompi_mpi_comm_world);
      if (4 < local_d4) break;
      if (1 < uVar16) {
        update_rating(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                            *)local_c8,pvVar11,local_e8,this->start_user_id,
                      this->R_workload_update_rating,true);
        update_rating(this,this_00,local_c0,local_e0,this->start_item_id,
                      this->Rt_workload_update_rating,true);
      }
      global_reg = 0.0;
      global_loss = 0.0;
      local_b0 = (double)CONCAT44(local_b0._4_4_,
                                  CONCAT31((int3)((local_94 | uVar20) >> 8),(local_94 | uVar20) == 0
                                          ));
      pPVar15 = this->parameter;
      local_88 = uVar21;
      for (iVar19 = 1; pvVar3 = local_c0, pvVar1 = local_e0, iVar19 <= pPVar15->max_inner_iter;
          iVar19 = iVar19 + 1) {
        global_reg = 0.0;
        vVar22 = rank_one_update(this,this_00,local_c0,local_e0,this->start_item_id,
                                 this->end_item_id,this->Rt_workload_rank_one_update);
        global_the_other = local_e8;
        global_reg = vVar22 + global_reg;
        MPI_Allgather(pvVar3,this->P_workload,&ompi_mpi_double,local_e8,this->P_workload,
                      &ompi_mpi_double,&ompi_mpi_comm_world);
        vVar22 = rank_one_update(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                                       *)local_c8,pvVar11,global_the_other,this->start_user_id,
                                 this->end_user_id,this->R_workload_rank_one_update);
        global_reg = vVar22 + global_reg;
        MPI_Allgather(pvVar11,this->Q_workload,&ompi_mpi_double,pvVar1,this->Q_workload,
                      &ompi_mpi_double,&ompi_mpi_comm_world);
        MPI_Allreduce(&global_reg,&global_loss,1,&ompi_mpi_double,&ompi_mpi_op_sum,
                      &ompi_mpi_comm_world);
        pPVar15 = this->parameter;
        auVar10._8_8_ = uStack_70;
        auVar10._0_8_ = local_78;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = global_loss;
        if (global_loss < local_78 * pPVar15->eps) {
          local_d4 = local_d4 + (uint)(iVar19 == 1);
          break;
        }
        auVar24 = vmaxsd_avx(auVar27,auVar10);
        uStack_70 = auVar24._8_8_;
        local_78 = (double)((ulong)(SUB81(local_b0,0) & 1) *
                            ((ulong)(iVar19 == 1) * (long)local_78 +
                            (ulong)(iVar19 != 1) * auVar24._0_8_) +
                           (ulong)!(bool)(SUB81(local_b0,0) & 1) * auVar24._0_8_);
      }
      update_rating(this,(unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                          *)local_c8,pvVar11,local_e8,this->start_user_id,
                    this->R_workload_update_rating,false);
      loss = update_rating(this,this_00,local_c0,local_e0,this->start_user_id,
                           this->Rt_workload_update_rating,false);
      Monitor::stop(&timer);
      dVar23 = Monitor::getElapsedTimeInSec(&timer);
      pvVar1 = local_d0;
      pPVar15 = this->parameter;
      if (pPVar15->verbose == true) {
        lVar17 = 0;
        local_b0 = dVar23;
        while (lVar17 < (long)this->end_item_id - (long)this->start_item_id) {
          global_reg_1._0_4_ = this->start_item_id + (int)lVar17;
          pmVar12 = std::__detail::
                    _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this_00,(key_type *)&global_reg_1);
          pdVar2 = local_a8 + lVar17;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = *pdVar2;
          auVar8._8_8_ = in_XMM4_Qb;
          auVar8._0_8_ = in_XMM4_Qa;
          auVar24 = vcvtusi2sd_avx512f(auVar8,(long)(pmVar12->
                                                                                                        
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(pmVar12->
                                                                                                        
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 4);
          pvVar3 = local_c0 + lVar17;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *pvVar3;
          lVar17 = lVar17 + 1;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_108;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *pvVar3 * auVar24._0_8_;
          auVar25 = vfmadd213sd_fma(auVar39,auVar36,auVar5);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = auVar24._0_8_ * *pdVar2;
          auVar24 = vfnmadd213sd_fma(auVar28,auVar41,auVar25);
          local_108 = auVar24._0_8_;
        }
        lVar17 = 0;
        while (lVar17 < (long)this->end_user_id - (long)this->start_user_id) {
          global_reg_1._0_4_ = this->start_user_id + (int)lVar17;
          pmVar12 = std::__detail::
                    _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_c8,(key_type *)&global_reg_1);
          pdVar2 = pvVar1 + lVar17;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *pdVar2;
          auVar9._8_8_ = in_XMM4_Qb;
          auVar9._0_8_ = in_XMM4_Qa;
          auVar24 = vcvtusi2sd_avx512f(auVar9,(long)(pmVar12->
                                                                                                        
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(pmVar12->
                                                                                                        
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 4);
          pvVar3 = pvVar11 + lVar17;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *pvVar3;
          lVar17 = lVar17 + 1;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_108;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = *pvVar3 * auVar24._0_8_;
          auVar25 = vfmadd213sd_fma(auVar40,auVar37,auVar6);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = auVar24._0_8_ * *pdVar2;
          auVar24 = vfnmadd213sd_fma(auVar29,auVar42,auVar25);
          local_108 = auVar24._0_8_;
        }
        MPI_Allreduce(&local_108,&global_reg_1,1,&ompi_mpi_double,&ompi_mpi_op_sum,
                      &ompi_mpi_comm_world);
        MPI_Allreduce(&loss,&global_loss_1,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world)
        ;
        uVar16 = local_fc;
        auVar30._4_4_ = global_reg_1._4_4_;
        auVar30._0_4_ = global_reg_1._0_4_;
        auVar30._8_8_ = 0;
        iVar19 = (int)local_88;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = this->parameter->lambda;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = global_loss_1;
        auVar24 = vfmadd213sd_fma(auVar38,auVar30,auVar7);
        dVar32 = auVar24._0_8_;
        if (this->machine_id == 0) {
          poVar14 = std::operator<<((ostream *)&std::cout,"machine id ");
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->machine_id);
          poVar14 = std::operator<<(poVar14,", iter ");
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar16);
          poVar14 = std::operator<<(poVar14,", rank ");
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar19 + 1);
          std::operator<<(poVar14,", time ");
          dVar23 = Monitor::getElapsedTimeInSec(&timer);
          poVar14 = std::ostream::_M_insert<double>(dVar23);
          std::operator<<(poVar14," sec, loss ");
          poVar14 = std::ostream::_M_insert<double>(global_loss_1);
          std::operator<<(poVar14,", obj ");
          poVar14 = std::ostream::_M_insert<double>(dVar32);
          std::operator<<(poVar14,", diff ");
          poVar14 = std::ostream::_M_insert<double>(local_90 - dVar32);
          std::operator<<(poVar14,", reg ");
          poVar14 = std::ostream::_M_insert<double>
                              ((double)CONCAT44(global_reg_1._4_4_,global_reg_1._0_4_));
          std::endl<char,std::char_traits<char>>(poVar14);
          if (this->machine_id == 0) {
            std::operator<<((ostream *)&std::cout,"RMSE of training data: ");
            auVar31._0_8_ = global_loss_1 / (double)this->train_rating_num;
            auVar31._8_8_ = 0;
            if (auVar31._0_8_ < 0.0) {
              dVar23 = sqrt(auVar31._0_8_);
            }
            else {
              auVar24 = vsqrtsd_avx(auVar31,auVar31);
              dVar23 = auVar24._0_8_;
            }
            poVar14 = std::ostream::_M_insert<double>(dVar23);
            std::endl<char,std::char_traits<char>>(poVar14);
          }
        }
        pPVar15 = this->parameter;
        dVar23 = local_b0;
        local_90 = dVar32;
      }
      else {
        iVar19 = (int)local_88;
        uVar16 = local_fc;
      }
      uVar21 = (ulong)(iVar19 + 1);
      local_b8 = local_b8 + dVar23;
    }
    uVar16 = uVar16 + 1;
    pvVar11 = local_d0;
  } while( true );
}

Assistant:

void train() {

        // only update the vectors belonging to this machines, but it will keep copies of all vectors from different machines
        value_type *last_q4d = new value_type[Q_workload];
        value_type *last_p4d = new value_type[P_workload];
        value_type *u = new value_type[user_num];
        value_type *v = new value_type[item_num];

        value_type reg = 0;
        value_type prev_obj = 0;

        if (parameter->verbose) {
            for (int d = 0; d < parameter->k; d++) {
                for (int user_index = 0; user_index < end_user_id - start_user_id; user_index++) {
                    // P is zero matrix at the beginning
                    reg += Q[d * Q_workload + user_index] * Q[d * Q_workload + user_index] * user_item_R[user_index + start_user_id].size();
                }
            }

            value_type loss = 0;
            for(auto rating:train_ratings){
                value_type score = rating.score;
                // P is zero matrix at the beginning
//                for (int d = 0; d < parameter->k; d++) {
//                    score -= Q[d * Q_workload + rating.user_id - start_user_id] * P[d * P_workload + rating.item_id - start_item_id];
//                }
                loss += score * score;
            }

            value_type global_reg, global_loss;

            MPI_Allreduce(&reg, &global_reg, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);
            MPI_Allreduce(&loss, &global_loss, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

            value_type obj = global_loss + global_reg * parameter->lambda;

            if(machine_id==0) {
                cout << "machine id " << machine_id << ", iter " << 0 << ", rank " << "None"
                     << ", time " << 0
                     << " sec, loss " << global_loss << ", obj " << obj << ", diff " << "None"
                     << ", reg " << global_reg
                     << endl;
            }

            if(machine_id==0) {
                cout << "RMSE of training data: " << sqrt(global_loss / train_rating_num) << endl;
            }
        }

        Monitor timer;
        value_type total_training_time = 0;

        for (int outer_iter = 1; outer_iter <= parameter->max_iter; outer_iter++) {

            int early_stop = 0;

            value_type fundec_max = 0;

            for (int d = 0; d < parameter->k; d++) {

                timer.start();

                // the factors belonging to this machines
                value_type *q4d = Q + d * Q_workload;
                value_type *p4d = P + d * P_workload;

                init_factor(q4d, p4d, last_q4d, last_p4d);

                MPI_Allgather(q4d, Q_workload, VALUE_MPI_TYPE, u, Q_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);
                MPI_Allgather(p4d, P_workload, VALUE_MPI_TYPE, v, P_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

                // it is not stated in the paper, but found in the implementation.
                if(early_stop >= 5) {
                    break;
                }

                // Create Rhat = user_item_R + Wt Ht^T
                if(outer_iter > 1){
                    update_rating(user_item_R, q4d, v, start_user_id, R_workload_update_rating, true);
                    update_rating(item_user_R, p4d, u, start_item_id, Rt_workload_update_rating, true);
                }

                value_type innerfundec_cur = 0;
                value_type global_innerfundec_cur = 0;

                for (int inner_iter = 1; inner_iter <= parameter->max_inner_iter; inner_iter++) {

                    innerfundec_cur = 0;

                    // Update W_t and H_t
                    // Note p should be updated first since it is 0 at the beginning
                    innerfundec_cur += rank_one_update(item_user_R, p4d, u, start_item_id, end_item_id, Rt_workload_rank_one_update);

                    MPI_Allgather(p4d, P_workload, VALUE_MPI_TYPE, v, P_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

                    innerfundec_cur += rank_one_update(user_item_R, q4d, v, start_user_id, end_user_id, R_workload_rank_one_update);

                    MPI_Allgather(q4d, Q_workload, VALUE_MPI_TYPE, u, Q_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

                    MPI_Allreduce(&innerfundec_cur, &global_innerfundec_cur, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

                    if ((global_innerfundec_cur < fundec_max * parameter->eps)) {
                        if (inner_iter == 1) {
                            early_stop += 1;
                        }
                        break;
                    }

                    // the fundec of the first inner iter of the first rank of the first outer iteration could be too large!!
                    if(!(outer_iter==1 && d == 0 && inner_iter==1)) {
                        fundec_max = std::max(fundec_max, global_innerfundec_cur);
                    }

                }

                // Update user_item_R and item_user_R
                update_rating(user_item_R, q4d, v, start_user_id, R_workload_update_rating, false);
                value_type loss = update_rating(item_user_R, p4d, u, start_user_id, Rt_workload_update_rating, false);

                timer.stop();

                total_training_time += timer.getElapsedTime();

                if (parameter->verbose) {

                    for(int item_index = 0; item_index < end_item_id - start_item_id; item_index++) {
                        value_type c = item_user_R[item_index + start_item_id].size();
                        reg += c * p4d[item_index] * p4d[item_index];
                        reg -= c * last_p4d[item_index] * last_p4d[item_index];
                    }

                    for(int user_index = 0; user_index < end_user_id - start_user_id; user_index++) {
                        value_type c = user_item_R[user_index + start_user_id].size();
                        reg += c * q4d[user_index] * q4d[user_index];
                        reg -= c * last_q4d[user_index] * last_q4d[user_index];
                    }

                    value_type global_reg, global_loss;

                    MPI_Allreduce(&reg, &global_reg, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);
                    MPI_Allreduce(&loss, &global_loss, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

                    value_type obj = global_loss + global_reg * parameter->lambda;

                    if(machine_id==0) {
                        cout << "machine id " << machine_id << ", iter " << outer_iter << ", rank " << d + 1
                             << ", time " << timer.getElapsedTime()
                             << " sec, loss " << global_loss << ", obj " << obj << ", diff " << prev_obj - obj
                             << ", reg " << global_reg
                             << endl;
                    }

                    prev_obj = obj;

                    if(machine_id==0) {
                        cout << "RMSE of training data: " << sqrt(global_loss / train_rating_num) << endl;
                    }
                }
            }
        }

        cout << "training time: " << total_training_time << " secs" << endl;

        delete[] u;
        delete[] v;
        delete[] last_p4d;
        delete[] last_q4d;

    }